

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

TokenKind slang::syntax::SyntaxFacts::getDelimCloseKind(TokenKind kind)

{
  TokenKind kind_local;
  TokenKind local_2;
  
  switch(kind) {
  case ApostropheOpenBrace:
    local_2 = CloseBrace;
    break;
  case OpenBrace:
    local_2 = CloseBrace;
    break;
  default:
    local_2 = Unknown;
    break;
  case OpenBracket:
    local_2 = CloseBracket;
    break;
  case OpenParenthesis:
    local_2 = CloseParenthesis;
  }
  return local_2;
}

Assistant:

parsing::TokenKind SyntaxFacts::getDelimCloseKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenParenthesis: return TokenKind::CloseParenthesis;
        case TokenKind::OpenBrace: return TokenKind::CloseBrace;
        case TokenKind::OpenBracket: return TokenKind::CloseBracket;
        case TokenKind::ApostropheOpenBrace: return TokenKind::CloseBrace;
        default: return TokenKind::Unknown;
    }
}